

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TiledRgbaInputFile::setFrameBuffer
          (TiledRgbaInputFile *this,Rgba *base,size_t xStride,size_t yStride)

{
  long in_RCX;
  long in_RDX;
  char *in_RSI;
  FrameBuffer *in_RDI;
  FrameBuffer *in_stack_00000078;
  TiledInputFile *in_stack_00000080;
  FrameBuffer fb;
  size_t ys;
  size_t xs;
  lock_guard<std::mutex> lock;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 uVar1;
  undefined4 in_stack_fffffffffffffe14;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffe1c;
  char *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  string local_1a0 [32];
  Slice local_180;
  string local_148 [32];
  Slice local_128;
  string local_f0 [16];
  string *in_stack_ffffffffffffff20;
  size_t in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff30;
  Rgba *in_stack_ffffffffffffff38;
  FromYa *in_stack_ffffffffffffff40;
  string local_98 [80];
  size_t local_48;
  size_t local_40;
  char *local_10;
  
  if ((in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    local_40 = in_RDX << 3;
    local_48 = in_RCX << 3;
    local_10 = in_RSI;
    FrameBuffer::FrameBuffer((FrameBuffer *)0x24d9ea);
    std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    uVar2 = 0;
    uVar1 = 0;
    Slice::Slice((Slice *)&stack0xffffffffffffff30,HALF,local_10,local_40,local_48,1,1,0.0,false,
                 false);
    FrameBuffer::insert(in_RDI,(string *)CONCAT44(in_stack_fffffffffffffe1c,uVar2),
                        (Slice *)CONCAT44(in_stack_fffffffffffffe14,uVar1));
    std::__cxx11::string::~string(local_98);
    std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    uVar2 = 0;
    uVar1 = 0;
    Slice::Slice(&local_128,HALF,local_10 + 2,local_40,local_48,1,1,0.0,false,false);
    FrameBuffer::insert(in_RDI,(string *)CONCAT44(in_stack_fffffffffffffe1c,uVar2),
                        (Slice *)CONCAT44(in_stack_fffffffffffffe14,uVar1));
    std::__cxx11::string::~string(local_f0);
    std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    uVar2 = 0;
    uVar1 = 0;
    Slice::Slice(&local_180,HALF,local_10 + 4,local_40,local_48,1,1,0.0,false,false);
    FrameBuffer::insert(in_RDI,(string *)CONCAT44(in_stack_fffffffffffffe1c,uVar2),
                        (Slice *)CONCAT44(in_stack_fffffffffffffe14,uVar1));
    std::__cxx11::string::~string(local_148);
    std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    uVar2 = 0;
    uVar1 = 0;
    Slice::Slice((Slice *)&stack0xfffffffffffffe28,HALF,local_10 + 6,local_40,local_48,1,1,1.0,false
                 ,false);
    FrameBuffer::insert(in_RDI,(string *)CONCAT44(in_stack_fffffffffffffe1c,uVar2),
                        (Slice *)CONCAT44(in_stack_fffffffffffffe14,uVar1));
    std::__cxx11::string::~string(local_1a0);
    TiledInputFile::setFrameBuffer(in_stack_00000080,in_stack_00000078);
    FrameBuffer::~FrameBuffer((FrameBuffer *)0x24dc5f);
  }
  else {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)
               CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
               (mutex_type *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    FromYa::setFrameBuffer
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x24d98a);
  }
  return;
}

Assistant:

void
TiledRgbaInputFile::setFrameBuffer (Rgba* base, size_t xStride, size_t yStride)
{
    if (_fromYa)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_fromYa);
#endif
        _fromYa->setFrameBuffer (base, xStride, yStride, _channelNamePrefix);
    }
    else
    {
        size_t xs = xStride * sizeof (Rgba);
        size_t ys = yStride * sizeof (Rgba);

        FrameBuffer fb;

        fb.insert (
            _channelNamePrefix + "R",
            Slice (
                HALF,
                (char*) &base[0].r,
                xs,
                ys,
                1,
                1,     // xSampling, ySampling
                0.0)); // fillValue

        fb.insert (
            _channelNamePrefix + "G",
            Slice (
                HALF,
                (char*) &base[0].g,
                xs,
                ys,
                1,
                1,     // xSampling, ySampling
                0.0)); // fillValue

        fb.insert (
            _channelNamePrefix + "B",
            Slice (
                HALF,
                (char*) &base[0].b,
                xs,
                ys,
                1,
                1,     // xSampling, ySampling
                0.0)); // fillValue

        fb.insert (
            _channelNamePrefix + "A",
            Slice (
                HALF,
                (char*) &base[0].a,
                xs,
                ys,
                1,
                1,     // xSampling, ySampling
                1.0)); // fillValue

        _inputFile->setFrameBuffer (fb);
    }
}